

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.cpp
# Opt level: O1

void __thiscall helics::Input::forceCoreDataUpdate(Input *this)

{
  data_view dv;
  data_view local_30;
  
  if (this->fed != (ValueFederate *)0x0) {
    helics::ValueFederate::getBytes(&local_30,this->fed,this);
    if (local_30.dblock._M_len == 0) {
      if (this->inputVectorOp != NO_OP) {
        helics::ValueFederate::forceCoreUpdate(this->fed,this);
      }
    }
    else {
      helics::valueExtract(&local_30,this->injectionType,&this->lastValue);
    }
    if (local_30.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_30.ref.
                 super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

void Input::forceCoreDataUpdate()
{
    if (fed == nullptr) {
        return;
    }
    auto dv = fed->getBytes(*this);
    if (!dv.empty()) {
        valueExtract(dv, injectionType, lastValue);
    } else if (getMultiInputMode() != MultiInputHandlingMethod::NO_OP) {
        fed->forceCoreUpdate(*this);
    }
}